

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void __thiscall QMessagePattern::QMessagePattern(QMessagePattern *this)

{
  long lVar1;
  bool bVar2;
  rep rVar3;
  QMessagePattern *in_RDI;
  long in_FS_OFFSET;
  QString envPattern;
  QString *in_stack_00000228;
  QMessagePattern *in_stack_00000230;
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *in_stack_ffffffffffffff90;
  QMessagePattern *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::
  unique_ptr<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[],std::default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]>>
  ::
  unique_ptr<std::default_delete<std::unique_ptr<char_const[],std::default_delete<char_const[]>>[]>,void>
            ((unique_ptr<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[],_std::default_delete<std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>[]>_>
              *)in_stack_ffffffffffffff90);
  std::unique_ptr<char_const*[],std::default_delete<char_const*[]>>::
  unique_ptr<std::default_delete<char_const*[]>,void>(in_stack_ffffffffffffff90);
  QList<QString>::QList((QList<QString> *)0x2440c8);
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this_00->appStartTime).__d.__r = rVar3;
  QList<QMessagePattern::BacktraceParams>::QList
            ((QList<QMessagePattern::BacktraceParams> *)0x2440e4);
  this_00->maxBacktraceDepth = 0;
  qEnvironmentVariable((char *)this_00);
  bVar2 = QString::isEmpty((QString *)0x244128);
  if (bVar2) {
    setDefaultPattern(this_00);
    in_RDI->fromEnvironment = false;
  }
  else {
    setPattern(in_stack_00000230,in_stack_00000228);
    in_RDI->fromEnvironment = true;
  }
  QString::~QString((QString *)0x24419b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessagePattern::QMessagePattern()
{
    const QString envPattern = qEnvironmentVariable("QT_MESSAGE_PATTERN");
    if (envPattern.isEmpty()) {
        setDefaultPattern();
        fromEnvironment = false;
    } else {
        setPattern(envPattern);
        fromEnvironment = true;
    }
}